

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int check_repeat_ref_mv(MB_MODE_INFO_EXT *mbmi_ext,int ref_idx,MV_REFERENCE_FRAME *ref_frame,
                       PREDICTION_MODE single_mode)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int_mv *piVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int_mv *piVar8;
  int iVar9;
  
  bVar2 = av1_ref_frame_type(ref_frame);
  iVar3 = 0;
  iVar9 = (int)CONCAT71(in_register_00000009,single_mode);
  if (iVar9 != 0xd) {
    bVar1 = mbmi_ext->ref_mv_count[bVar2];
    if (iVar9 == 0xf) {
      uVar7 = (uint)bVar1;
      if (uVar7 != 0) {
        if (uVar7 == 1) {
          return 0;
        }
        uVar5 = 4;
        if (bVar1 < 4) {
          uVar5 = (ulong)uVar7;
        }
        lVar6 = uVar5 + 1;
        piVar4 = (int_mv *)(mbmi_ext->ref_mv_stack + bVar2);
        do {
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) {
            return 0;
          }
          piVar8 = piVar4 + 1;
          if (ref_idx == 0) {
            piVar8 = piVar4;
          }
          piVar4 = piVar4 + 2;
        } while (piVar8->as_int != mbmi_ext->global_mvs[ref_frame[(uint)ref_idx]].as_int);
      }
      iVar3 = 1;
    }
    else if ((iVar9 == 0xe) && (bVar1 < 2)) {
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static inline int check_repeat_ref_mv(const MB_MODE_INFO_EXT *mbmi_ext,
                                      int ref_idx,
                                      const MV_REFERENCE_FRAME *ref_frame,
                                      PREDICTION_MODE single_mode) {
  const uint8_t ref_frame_type = av1_ref_frame_type(ref_frame);
  const int ref_mv_count = mbmi_ext->ref_mv_count[ref_frame_type];
  assert(single_mode != NEWMV);
  if (single_mode == NEARESTMV) {
    return 0;
  } else if (single_mode == NEARMV) {
    // when ref_mv_count = 0, NEARESTMV and NEARMV are same as GLOBALMV
    // when ref_mv_count = 1, NEARMV is same as GLOBALMV
    if (ref_mv_count < 2) return 1;
  } else if (single_mode == GLOBALMV) {
    // when ref_mv_count == 0, GLOBALMV is same as NEARESTMV
    if (ref_mv_count == 0) return 1;
    // when ref_mv_count == 1, NEARMV is same as GLOBALMV
    else if (ref_mv_count == 1)
      return 0;

    int stack_size = AOMMIN(USABLE_REF_MV_STACK_SIZE, ref_mv_count);
    // Check GLOBALMV is matching with any mv in ref_mv_stack
    for (int ref_mv_idx = 0; ref_mv_idx < stack_size; ref_mv_idx++) {
      int_mv this_mv;

      if (ref_idx == 0)
        this_mv = mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_idx].this_mv;
      else
        this_mv = mbmi_ext->ref_mv_stack[ref_frame_type][ref_mv_idx].comp_mv;

      if (this_mv.as_int == mbmi_ext->global_mvs[ref_frame[ref_idx]].as_int)
        return 1;
    }
  }
  return 0;
}